

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O3

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  stbi_uc *psVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  long lVar12;
  
  lVar12 = 0;
  do {
    sVar1 = stbi__get8(s);
    if (sVar1 != anon_var_dwarf_2583b9[lVar12]) goto LAB_0033a903;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar8 = s->img_buffer;
LAB_0033a85f:
    s->img_buffer = psVar8 + 0x58;
  }
  else {
    psVar8 = s->img_buffer;
    iVar9 = (int)s->img_buffer_end - (int)psVar8;
    if (0x57 < iVar9) goto LAB_0033a85f;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar9);
  }
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (x != (int *)0x0) {
    *x = (uint)CONCAT11(sVar1,sVar2);
  }
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  uVar6 = (uint)CONCAT11(sVar3,sVar4);
  if (y != (int *)0x0) {
    *y = uVar6;
    uVar6 = (uint)CONCAT11(sVar1,sVar2);
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0033a8cf:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_0033a903;
  }
  else {
    iVar9 = (*(s->io).eof)(s->io_user_data);
    if (iVar9 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_0033a903;
      goto LAB_0033a8cf;
    }
  }
  uVar10 = uVar6;
  if (x != (int *)0x0) {
    uVar10 = *x;
  }
  if (uVar10 != 0) {
    if (y != (int *)0x0) {
      uVar6 = *y;
    }
    if ((int)(0x10000000 / (long)(int)uVar10) < (int)uVar6) {
LAB_0033a903:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
    psVar8 = s->img_buffer;
  }
  else {
    psVar8 = s->img_buffer;
    iVar9 = (int)s->img_buffer_end - (int)psVar8;
    if (iVar9 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar9);
      goto LAB_0033a96c;
    }
  }
  s->img_buffer = psVar8 + 8;
LAB_0033a96c:
  iVar9 = 0xb;
  bVar11 = 0;
  do {
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) {
      return 0;
    }
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    stbi__get8(s);
    bVar5 = stbi__get8(s);
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0033a9be:
      if (s->img_buffer_end <= s->img_buffer) goto LAB_0033a903;
    }
    else {
      iVar7 = (*(s->io).eof)(s->io_user_data);
      if (iVar7 != 0) {
        if (s->read_from_callbacks != 0) goto LAB_0033a9be;
        goto LAB_0033a903;
      }
    }
    if (sVar2 != '\b') goto LAB_0033a903;
    bVar11 = bVar11 | bVar5;
    if (sVar1 == '\0') {
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar11 & 0x10) == 0);
        return 1;
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained,dummy;
   stbi__pic_packet packets[10];

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}